

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_channel_map_init_blank(ma_channel *pChannelMap,ma_uint32 channels)

{
  uint in_ESI;
  void *in_RDI;
  
  if (((in_RDI != (void *)0x0) && (in_RDI != (void *)0x0)) && ((ulong)in_ESI != 0)) {
    memset(in_RDI,0,(ulong)in_ESI);
  }
  return;
}

Assistant:

MA_API void ma_channel_map_init_blank(ma_channel* pChannelMap, ma_uint32 channels)
{
    if (pChannelMap == NULL) {
        return;
    }

    MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channels);
}